

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priorbox.cpp
# Opt level: O1

int __thiscall
ncnn::PriorBox::forward
          (PriorBox *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  pointer pMVar8;
  Mat *this_00;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  ulong uVar13;
  float *pfVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  uint uVar29;
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  
  pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = pMVar8->h;
  iVar18 = this->image_width;
  iVar15 = this->image_height;
  if (iVar18 == -0xe9) {
    iVar18 = pMVar8[1].w;
  }
  iVar4 = pMVar8->w;
  if (iVar15 == -0xe9) {
    iVar15 = pMVar8[1].h;
  }
  fVar24 = this->step_width;
  fVar1 = this->step_height;
  uVar5 = (this->min_sizes).w;
  iVar6 = (this->max_sizes).w;
  uVar7 = (this->aspect_ratios).w;
  iVar20 = this->flip;
  if (this->flip != 0) {
    iVar20 = uVar7 * uVar5;
  }
  iVar20 = uVar7 * uVar5 + iVar6 + uVar5 + iVar20;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,iVar4 * uVar3 * iVar20 * 4,2,4,opt->blob_allocator);
  if (0 < (int)uVar3) {
    fVar22 = (float)iVar18;
    fVar25 = (float)iVar15;
    uVar21 = -(uint)(fVar24 == -233.0);
    fVar24 = (float)(~uVar21 & (uint)fVar24 | (uint)(fVar22 / (float)iVar4) & uVar21);
    uVar21 = -(uint)(fVar1 == -233.0);
    uVar29 = (uint)(fVar25 / (float)(int)uVar3) & uVar21;
    pvVar9 = this_00->data;
    auVar30._4_4_ = fVar25;
    auVar30._0_4_ = fVar22;
    auVar30._8_4_ = fVar22;
    auVar30._12_4_ = fVar25;
    auVar30 = rcpps(ZEXT416(uVar29),auVar30);
    fVar23 = auVar30._0_4_;
    fVar26 = auVar30._4_4_;
    fVar27 = auVar30._8_4_;
    fVar28 = auVar30._12_4_;
    fVar23 = (1.0 - fVar22 * fVar23) * fVar23 + fVar23;
    fVar26 = (1.0 - fVar25 * fVar26) * fVar26 + fVar26;
    fVar27 = (1.0 - fVar22 * fVar27) * fVar27 + fVar27;
    fVar28 = (1.0 - fVar25 * fVar28) * fVar28 + fVar28;
    uVar16 = 0;
    do {
      if (0 < iVar4) {
        fVar22 = ((float)(int)uVar16 + this->offset) * (float)(~uVar21 & (uint)fVar1 | uVar29);
        fVar25 = this->offset * fVar24;
        pfVar14 = (float *)((long)pvVar9 + (long)(iVar20 * iVar4 * 4 * (int)uVar16) * 4);
        pvVar10 = (this->min_sizes).data;
        iVar18 = 0;
        do {
          if (0 < (int)uVar5) {
            pvVar11 = (this->max_sizes).data;
            pvVar12 = (this->aspect_ratios).data;
            iVar15 = this->flip;
            uVar19 = 0;
            do {
              fVar2 = *(float *)((long)pvVar10 + uVar19 * 4);
              fVar31 = fVar2 * 0.5;
              *pfVar14 = (fVar25 - fVar31) * fVar23;
              pfVar14[1] = (fVar22 - fVar31) * fVar26;
              pfVar14[2] = (fVar31 + fVar25) * fVar27;
              pfVar14[3] = (fVar31 + fVar22) * fVar28;
              if (iVar6 < 1) {
                pfVar14 = pfVar14 + 4;
              }
              else {
                fVar32 = SQRT(*(float *)((long)pvVar11 + uVar19 * 4) * fVar2) * 0.5;
                pfVar14[4] = (fVar25 - fVar32) * fVar23;
                pfVar14[5] = (fVar22 - fVar32) * fVar26;
                pfVar14[6] = (fVar32 + fVar25) * fVar27;
                pfVar14[7] = (fVar32 + fVar22) * fVar28;
                pfVar14 = pfVar14 + 8;
              }
              if (0 < (int)uVar7) {
                uVar13 = 0;
                do {
                  fVar32 = *(float *)((long)pvVar12 + uVar13 * 4);
                  auVar30 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar32));
                  fVar34 = auVar30._0_4_;
                  fVar33 = fVar32 * fVar34 * fVar34 + -3.0;
                  fVar32 = (float)(~-(uint)(ABS(fVar32) < 1.1754944e-38) &
                                  (uint)(fVar32 * fVar34 * -0.5 * fVar33)) * fVar2 * 0.5;
                  fVar33 = fVar34 * -0.5 * fVar31 * fVar33;
                  *pfVar14 = (fVar25 - fVar32) * fVar23;
                  pfVar14[1] = (fVar22 - fVar33) * fVar26;
                  pfVar14[2] = (fVar25 + fVar32) * fVar27;
                  pfVar14[3] = (fVar22 + fVar33) * fVar28;
                  if (iVar15 == 0) {
                    pfVar14 = pfVar14 + 4;
                  }
                  else {
                    pfVar14[4] = (fVar25 - fVar33) * fVar23;
                    pfVar14[5] = (fVar22 - fVar32) * fVar26;
                    pfVar14[6] = (fVar25 + fVar33) * fVar27;
                    pfVar14[7] = (fVar22 + fVar32) * fVar28;
                    pfVar14 = pfVar14 + 8;
                  }
                  uVar13 = uVar13 + 1;
                } while (uVar7 != uVar13);
              }
              uVar19 = uVar19 + 1;
            } while (uVar19 != uVar5);
          }
          fVar25 = fVar25 + fVar24;
          iVar18 = iVar18 + 1;
        } while (iVar18 != iVar4);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar3);
  }
  if ((this->clip != 0) && (iVar18 = this_00->w, 0 < (long)iVar18)) {
    pvVar9 = this_00->data;
    lVar17 = 0;
    do {
      fVar24 = *(float *)((long)pvVar9 + lVar17 * 4);
      if (fVar24 <= 0.0) {
        fVar24 = 0.0;
      }
      if (1.0 <= fVar24) {
        fVar24 = 1.0;
      }
      *(float *)((long)pvVar9 + lVar17 * 4) = fVar24;
      lVar17 = lVar17 + 1;
    } while (iVar18 != lVar17);
  }
  iVar18 = this_00->w;
  lVar17 = (long)iVar18;
  iVar15 = iVar18 + 3;
  if (-1 < lVar17) {
    iVar15 = iVar18;
  }
  if (3 < lVar17) {
    iVar15 = iVar15 >> 2;
    pfVar14 = (float *)(lVar17 * 4 + (long)this_00->data);
    do {
      *pfVar14 = this->variances[0];
      pfVar14[1] = this->variances[1];
      pfVar14[2] = this->variances[2];
      pfVar14[3] = this->variances[3];
      pfVar14 = pfVar14 + 4;
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
  }
  return 0;
}

Assistant:

int PriorBox::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int w = bottom_blobs[0].w;
    int h = bottom_blobs[0].h;

    int image_w = image_width;
    int image_h = image_height;
    if (image_w == -233)
        image_w = bottom_blobs[1].w;
    if (image_h == -233)
        image_h = bottom_blobs[1].h;

    float step_w = step_width;
    float step_h = step_height;
    if (step_w == -233)
        step_w = (float)image_w / w;
    if (step_h == -233)
        step_h = (float)image_h / h;

    int num_min_size = min_sizes.w;
    int num_max_size = max_sizes.w;
    int num_aspect_ratio = aspect_ratios.w;

    int num_prior = num_min_size * num_aspect_ratio + num_min_size + num_max_size;
    if (flip)
        num_prior += num_min_size * num_aspect_ratio;

    Mat& top_blob = top_blobs[0];
    top_blob.create(4 * w * h * num_prior, 2, 4u, opt.blob_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < h; i++)
    {
        float* box = (float*)top_blob + i * w * num_prior * 4;

        float center_x = offset * step_w;
        float center_y = offset * step_h + i * step_h;

        for (int j = 0; j < w; j++)
        {
            float box_w;
            float box_h;

            for (int k = 0; k < num_min_size; k++)
            {
                float min_size = min_sizes[k];

                // min size box
                box_w = box_h = min_size;

                box[0] = (center_x - box_w * 0.5f) / image_w;
                box[1] = (center_y - box_h * 0.5f) / image_h;
                box[2] = (center_x + box_w * 0.5f) / image_w;
                box[3] = (center_y + box_h * 0.5f) / image_h;

                box += 4;

                if (num_max_size > 0)
                {
                    float max_size = max_sizes[k];

                    // max size box
                    box_w = box_h = sqrt(min_size * max_size);

                    box[0] = (center_x - box_w * 0.5f) / image_w;
                    box[1] = (center_y - box_h * 0.5f) / image_h;
                    box[2] = (center_x + box_w * 0.5f) / image_w;
                    box[3] = (center_y + box_h * 0.5f) / image_h;

                    box += 4;
                }

                // all aspect_ratios
                for (int p = 0; p < num_aspect_ratio; p++)
                {
                    float ar = aspect_ratios[p];

                    box_w = min_size * sqrt(ar);
                    box_h = min_size / sqrt(ar);

                    box[0] = (center_x - box_w * 0.5f) / image_w;
                    box[1] = (center_y - box_h * 0.5f) / image_h;
                    box[2] = (center_x + box_w * 0.5f) / image_w;
                    box[3] = (center_y + box_h * 0.5f) / image_h;

                    box += 4;

                    if (flip)
                    {
                        box[0] = (center_x - box_h * 0.5f) / image_w;
                        box[1] = (center_y - box_w * 0.5f) / image_h;
                        box[2] = (center_x + box_h * 0.5f) / image_w;
                        box[3] = (center_y + box_w * 0.5f) / image_h;

                        box += 4;
                    }
                }
            }

            center_x += step_w;
        }

        center_y += step_h;
    }

    if (clip)
    {
        float* box = top_blob;
        for (int i = 0; i < top_blob.w; i++)
        {
            box[i] = std::min(std::max(box[i], 0.f), 1.f);
        }
    }

    // set variance
    float* var = top_blob.row(1);
    for (int i = 0; i < top_blob.w / 4; i++)
    {
        var[0] = variances[0];
        var[1] = variances[1];
        var[2] = variances[2];
        var[3] = variances[3];

        var += 4;
    }

    return 0;
}